

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O2

void Cba_ManWriteVerilog(char *pFileName,Cba_Man_t *p,int fInlineConcat)

{
  Vec_Str_t *p_00;
  void *pvVar1;
  void *pvVar2;
  char *pStr;
  Cba_Ntk_t *p_01;
  FILE *__s;
  int i;
  
  pvVar1 = p->pMioLib;
  if (pvVar1 != (void *)0x0) {
    pvVar2 = Abc_FrameReadLibGen();
    if (pvVar1 != pvVar2) {
      puts("Genlib library used in the mapped design is not longer a current library.");
      return;
    }
  }
  Cba_ManCreatePrimMap(p->pTypeNames);
  p->nOpens = 1;
  (p->vOut).nSize = 0;
  p_00 = &p->vOut;
  (p->vOut2).nSize = 0;
  Vec_StrPrintStr(p_00,"// Design \"");
  Vec_StrPrintStr(p_00,p->pName);
  Vec_StrPrintStr(p_00,"\" written via CBA package in ABC on ");
  pStr = Extra_TimeStamp();
  Vec_StrPrintStr(p_00,pStr);
  Vec_StrPrintStr(p_00,"\n\n");
  for (i = 1; i < (p->vNtks).nSize; i = i + 1) {
    p_01 = Cba_ManNtk(p,i);
    Cba_ManWriteVerilogNtk(p_01,fInlineConcat);
  }
  if (0 < (p->vOut).nSize) {
    __s = fopen(pFileName,"wb");
    if (__s != (FILE *)0x0) {
      fwrite((p->vOut).pArray,1,(long)(p->vOut).nSize,__s);
      fclose(__s);
      return;
    }
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
    return;
  }
  return;
}

Assistant:

void Cba_ManWriteVerilog( char * pFileName, Cba_Man_t * p, int fInlineConcat )
{
    Cba_Ntk_t * pNtk; int i;
    // check the library
    if ( p->pMioLib && p->pMioLib != Abc_FrameReadLibGen() )
    {
        printf( "Genlib library used in the mapped design is not longer a current library.\n" );
        return;
    }
    Cba_ManCreatePrimMap( p->pTypeNames );
    // derive the stream
    p->nOpens = 1;
    Vec_StrClear( &p->vOut );
    Vec_StrClear( &p->vOut2 );
    Vec_StrPrintStr( &p->vOut, "// Design \"" );
    Vec_StrPrintStr( &p->vOut, Cba_ManName(p) );
    Vec_StrPrintStr( &p->vOut, "\" written via CBA package in ABC on " );
    Vec_StrPrintStr( &p->vOut, Extra_TimeStamp() );
    Vec_StrPrintStr( &p->vOut, "\n\n" );
    Cba_ManForEachNtk( p, pNtk, i )
        Cba_ManWriteVerilogNtk( pNtk, fInlineConcat );
    // dump into file
    if ( Vec_StrSize(&p->vOut) > 0 )
    {
        FILE * pFile = fopen( pFileName, "wb" );
        if ( pFile == NULL )
            printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        else
        {
            fwrite( Vec_StrArray(&p->vOut), 1, Vec_StrSize(&p->vOut), pFile );
            fclose( pFile );
        }
    }
}